

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

void closed_handle_large_write_cb(uv_write_t *req,int status)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 extraout_RAX;
  uv_timer_t *unaff_RBX;
  uv_timer_t *puVar5;
  uv_timer_t *puVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  uv_timer_t auStack_390 [5];
  uv_timer_t *puStack_40;
  
  if (status == 0) {
    closed_handle_data_read = 100000;
    write_reqs_completed = write_reqs_completed + 1;
    if (write_reqs_completed == 300) {
      write_reqs_completed = 0;
      uVar1 = write_until_data_queued();
      if (uVar1 != 0) {
        send_handle_and_close();
        return;
      }
    }
    return;
  }
  closed_handle_large_write_cb_cold_1();
  if (status == -9) {
    closed_handle_write = 1;
    return;
  }
  closed_handle_write_cb_cold_1();
  lVar3 = uv_default_loop();
  iVar2 = uv_loop_alive();
  if (iVar2 == 0) {
    uVar4 = uv_default_loop();
    unaff_RBX = &timer_handle;
    uv_timer_init(uVar4,&timer_handle);
    status = 0x163797;
    uv_timer_start(&timer_handle,timer_cb,100,0);
    lVar3 = uv_default_loop();
    iVar2 = uv_loop_alive();
    if (iVar2 == 0) goto LAB_00163774;
    lVar3 = uv_default_loop();
    status = 0;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_00163779;
    lVar3 = uv_default_loop();
    iVar2 = uv_loop_alive();
    if (iVar2 != 0) goto LAB_0016377e;
    lVar3 = uv_default_loop();
    status = 0x30dc00;
    iVar2 = uv_queue_work(lVar3,&work_req,work_cb,after_work_cb);
    if (iVar2 != 0) goto LAB_00163783;
    lVar3 = uv_default_loop();
    iVar2 = uv_loop_alive();
    if (iVar2 == 0) goto LAB_00163788;
    lVar3 = uv_default_loop();
    status = 0;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0016378d;
    lVar3 = uv_default_loop();
    iVar2 = uv_loop_alive();
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_loop_alive_cold_1();
LAB_00163774:
    run_test_loop_alive_cold_8();
LAB_00163779:
    run_test_loop_alive_cold_2();
LAB_0016377e:
    run_test_loop_alive_cold_3();
LAB_00163783:
    run_test_loop_alive_cold_4();
LAB_00163788:
    run_test_loop_alive_cold_7();
LAB_0016378d:
    run_test_loop_alive_cold_5();
  }
  run_test_loop_alive_cold_6();
  if (lVar3 != 0) {
    return;
  }
  timer_cb_cold_1();
  if (lVar3 != 0) {
    return;
  }
  work_cb_cold_1();
  if (lVar3 == 0) {
    after_work_cb_cold_2();
  }
  else if (status == 0) {
    return;
  }
  after_work_cb_cold_1();
  puVar5 = auStack_390;
  puVar6 = puVar5;
  auStack_390[0].data = puVar5;
  puStack_40 = unaff_RBX;
  iVar2 = uv_loop_init();
  if (iVar2 == 0) {
    if ((uv_timer_t *)auStack_390[0].data != puVar5) goto LAB_0016388e;
    puVar5 = &timer_handle;
    puVar6 = auStack_390;
    uv_timer_init(puVar6,&timer_handle);
    uv_timer_start(&timer_handle,timer_cb,100,100);
    iVar2 = uv_loop_close();
    if (iVar2 != -0x10) goto LAB_00163893;
    puVar5 = auStack_390;
    uv_run(puVar5,0);
    uv_close(&timer_handle,0);
    puVar6 = puVar5;
    iVar2 = uv_run(puVar5,0);
    if (iVar2 != 0) goto LAB_00163898;
    if ((uv_timer_t *)auStack_390[0].data != puVar5) goto LAB_0016389d;
    puVar5 = auStack_390;
    puVar6 = puVar5;
    iVar2 = uv_loop_close();
    if (iVar2 != 0) goto LAB_001638a2;
    if ((uv_timer_t *)auStack_390[0].data == puVar5) {
      return;
    }
  }
  else {
    run_test_loop_close_cold_1();
LAB_0016388e:
    run_test_loop_close_cold_2();
LAB_00163893:
    run_test_loop_close_cold_3();
LAB_00163898:
    run_test_loop_close_cold_4();
LAB_0016389d:
    run_test_loop_close_cold_5();
LAB_001638a2:
    run_test_loop_close_cold_6();
  }
  run_test_loop_close_cold_7();
  if (puVar6 != (uv_timer_t *)0x0) {
    uv_stop(puVar6->loop);
    return;
  }
  uVar4 = extraout_RAX;
  timer_cb_cold_1();
  iVar2 = uv_loop_init(&run_test_loop_instant_close::loop);
  if (iVar2 == 0) {
    iVar2 = uv_queue_work(&run_test_loop_instant_close::loop,&run_test_loop_instant_close::req,
                          loop_instant_close_work_cb,loop_instant_close_after_work_cb,in_R8,in_R9,
                          puVar5,uVar4);
    if (iVar2 == 0) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00163938;
    }
  }
  else {
    run_test_loop_instant_close_cold_1();
  }
  run_test_loop_instant_close_cold_2();
LAB_00163938:
  run_test_loop_instant_close_cold_3();
  return;
}

Assistant:

static void closed_handle_large_write_cb(uv_write_t* req, int status) {
  ASSERT(status == 0);
  ASSERT(closed_handle_data_read = LARGE_SIZE);
  if (++write_reqs_completed == ARRAY_SIZE(write_reqs)) {
    write_reqs_completed = 0;
    if (write_until_data_queued() > 0)
      send_handle_and_close();
  }
}